

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QUrl __thiscall QVariant::toUrl(QVariant *this)

{
  qvariant_cast<QUrl>(this);
  return (QUrl)(QUrlPrivate *)this;
}

Assistant:

QUrl QVariant::toUrl() const
{
    return qvariant_cast<QUrl>(*this);
}